

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

void __thiscall QDockAreaLayout::fitLayout(QDockAreaLayout *this)

{
  int iVar1;
  long in_FS_OFFSET;
  QList<QLayoutStruct> local_68;
  QList<QLayoutStruct> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (QLayoutStruct *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QLayoutStruct>::QList(&local_48,3);
  local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.ptr = (QLayoutStruct *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QLayoutStruct>::QList(&local_68,3);
  getGrid(this,&local_48,&local_68);
  iVar1 = (this->rect).y1.m_i;
  qGeomCalc(&local_48,0,3,iVar1,((this->rect).y2.m_i - iVar1) + 1,this->sep);
  iVar1 = (this->rect).x1.m_i;
  qGeomCalc(&local_68,0,3,iVar1,((this->rect).x2.m_i - iVar1) + 1,this->sep);
  setGrid(this,&local_48,&local_68);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,0x20,0x10);
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,0x20,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayout::fitLayout()
{
    QList<QLayoutStruct> ver_struct_list(3);
    QList<QLayoutStruct> hor_struct_list(3);
    getGrid(&ver_struct_list, &hor_struct_list);

    qGeomCalc(ver_struct_list, 0, 3, rect.top(), rect.height(), sep);
    qGeomCalc(hor_struct_list, 0, 3, rect.left(), rect.width(), sep);

    setGrid(&ver_struct_list, &hor_struct_list);
}